

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

uint64 mkvmuxer::EbmlElementSize(uint64 type,uint8 *value,uint64 size)

{
  long lVar1;
  long lVar2;
  
  if (value != (uint8 *)0x0) {
    lVar2 = 1;
    lVar1 = 1;
    if ((((0xff < type) && (lVar1 = 2, 0xffff < type)) && (lVar1 = 3, 0xffffff < type)) &&
       (((lVar1 = 4, type >> 0x20 != 0 && (lVar1 = 5, type >> 0x28 != 0)) &&
        (lVar1 = 6, type >> 0x30 != 0)))) {
      lVar1 = 8 - (ulong)(type >> 0x38 == 0);
    }
    if (((0x7e < size) && (lVar2 = 2, 0x3ffe < size)) &&
       ((lVar2 = 3, 0x1ffffe < size &&
        (((lVar2 = 4, 0xffffffe < size && (lVar2 = 5, 0x7fffffffe < size)) &&
         (lVar2 = 6, 0x3fffffffffe < size)))))) {
      lVar2 = 8 - (ulong)(size < 0x1ffffffffffff);
    }
    return lVar1 + size + lVar2;
  }
  return 0;
}

Assistant:

uint64 EbmlElementSize(uint64 type, const uint8* value, uint64 size) {
  if (!value)
    return 0;

  // Size of EBML ID
  uint64 ebml_size = GetUIntSize(type);

  // Datasize
  ebml_size += size;

  // Size of Datasize
  ebml_size += GetCodedUIntSize(size);

  return ebml_size;
}